

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrLDX0xbe(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  
  argument = absolute_y_addr(in_RDI);
  LDX(in_RDI,argument);
  return 4;
}

Assistant:

int CPU::instrLDX0xbe() {
	LDX(absolute_y_addr());
	return 4;
}